

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_function.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::TableBindReplace(duckdb *this,ClientContext *context,TableFunctionBindInput *input)

{
  bool *pbVar1;
  pointer pVVar2;
  pointer pVVar3;
  bool bVar4;
  BinderException *this_00;
  reference pvVar5;
  vector<duckdb::Value,_true> *pvVar6;
  const_reference pvVar7;
  InvalidInputException *pIVar8;
  pointer pVVar9;
  char *pcVar10;
  ulong __n;
  string *this_01;
  QualifiedName qualified_name;
  string child;
  string union_all_clause;
  string query;
  string from_path;
  string by_name;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar6 = input->inputs;
  pVVar2 = (pvVar6->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3 = (pvVar6->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar9 = pVVar2;
  while (pVVar9 != pVVar3) {
    pbVar1 = &pVVar9->is_null;
    pVVar9 = pVVar9 + 1;
    if (*pbVar1 == true) {
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&qualified_name,"Cannot use NULL as function argument",
                 (allocator *)&from_path);
      BinderException::BinderException(this_00,&qualified_name.catalog);
      __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  query._M_dataplus._M_p = (pointer)&query.field_2;
  query._M_string_length = 0;
  query.field_2._M_local_buf[0] = '\0';
  pcVar10 = anon_var_dwarf_4b71df5 + 9;
  if ((long)pVVar3 - (long)pVVar2 == 0x80) {
    pvVar5 = vector<duckdb::Value,_true>::get<true>(pvVar6,1);
    if ((pvVar5->type_).id_ == BOOLEAN) {
      pvVar5 = vector<duckdb::Value,_true>::get<true>(input->inputs,1);
      bVar4 = Value::GetValue<bool>(pvVar5);
      pcVar10 = anon_var_dwarf_4b71df5 + 9;
      if (bVar4) {
        pcVar10 = "BY NAME ";
      }
    }
  }
  ::std::__cxx11::string::string((string *)&by_name,pcVar10,(allocator *)&qualified_name);
  pvVar5 = vector<duckdb::Value,_true>::get<true>(input->inputs,0);
  if ((pvVar5->type_).id_ == VARCHAR) {
    pvVar5 = vector<duckdb::Value,_true>::get<true>(input->inputs,0);
    Value::ToString_abi_cxx11_(&from_path,pvVar5);
    QualifiedName::Parse(&qualified_name,&from_path);
    QualifiedName::ToString_abi_cxx11_(&child,&qualified_name);
    ::std::operator+(&union_all_clause,"FROM ",&child);
    ::std::__cxx11::string::append((string *)&query);
    ::std::__cxx11::string::~string((string *)&union_all_clause);
    ::std::__cxx11::string::~string((string *)&child);
    QualifiedName::~QualifiedName(&qualified_name);
    this_01 = &from_path;
  }
  else {
    pvVar5 = vector<duckdb::Value,_true>::get<true>(input->inputs,0);
    LogicalType::LogicalType((LogicalType *)&from_path,VARCHAR);
    LogicalType::LIST((LogicalType *)&qualified_name,(LogicalType *)&from_path);
    bVar4 = LogicalType::operator==(&pvVar5->type_,(LogicalType *)&qualified_name);
    LogicalType::~LogicalType((LogicalType *)&qualified_name);
    LogicalType::~LogicalType((LogicalType *)&from_path);
    if (!bVar4) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&qualified_name,"Expected a table or a list with tables as input",
                 (allocator *)&from_path);
      InvalidInputException::InvalidInputException(pIVar8,&qualified_name.catalog);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::operator+(&qualified_name.catalog," UNION ALL ",&by_name);
    ::std::operator+(&union_all_clause,&qualified_name.catalog,"FROM ");
    ::std::__cxx11::string::~string((string *)&qualified_name);
    pvVar5 = vector<duckdb::Value,_true>::get<true>(input->inputs,0);
    pvVar6 = ListValue::GetChildren(pvVar5);
    if ((pvVar6->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar6->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&qualified_name,"Input list is empty",(allocator *)&from_path);
      InvalidInputException::InvalidInputException(pIVar8,&qualified_name.catalog);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar7 = vector<duckdb::Value,_true>::get<true>(pvVar6,0);
    Value::ToString_abi_cxx11_(&from_path,pvVar7);
    QualifiedName::Parse(&qualified_name,&from_path);
    ::std::__cxx11::string::~string((string *)&from_path);
    QualifiedName::ToString_abi_cxx11_(&child,&qualified_name);
    ::std::operator+(&from_path,"FROM ",&child);
    ::std::__cxx11::string::append((string *)&query);
    ::std::__cxx11::string::~string((string *)&from_path);
    ::std::__cxx11::string::~string((string *)&child);
    for (__n = 1; __n < (ulong)((long)(pvVar6->
                                      super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pvVar6->
                                      super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 6); __n = __n + 1
        ) {
      pvVar7 = vector<duckdb::Value,_true>::get<true>(pvVar6,__n);
      Value::ToString_abi_cxx11_(&child,pvVar7);
      QualifiedName::Parse((QualifiedName *)&from_path,&child);
      QualifiedName::ToString_abi_cxx11_(&local_70,(QualifiedName *)&from_path);
      ::std::operator+(&local_50,&union_all_clause,&local_70);
      ::std::__cxx11::string::append((string *)&query);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
      QualifiedName::~QualifiedName((QualifiedName *)&from_path);
      ::std::__cxx11::string::~string((string *)&child);
    }
    QualifiedName::~QualifiedName(&qualified_name);
    this_01 = &union_all_clause;
  }
  ::std::__cxx11::string::~string((string *)this_01);
  ::std::__cxx11::string::~string((string *)&by_name);
  ClientContext::GetParserOptions((ParserOptions *)&from_path,context);
  ::std::__cxx11::string::string
            ((string *)&qualified_name,"Expected a table or a list with tables as input",
             (allocator *)&union_all_clause);
  ParseSubquery((duckdb *)&by_name,&query,(ParserOptions *)&from_path,&qualified_name.catalog);
  ::std::__cxx11::string::~string((string *)&qualified_name);
  *(pointer *)this = by_name._M_dataplus._M_p;
  ::std::__cxx11::string::~string((string *)&query);
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

static unique_ptr<TableRef> TableBindReplace(ClientContext &context, TableFunctionBindInput &input) {
	auto query = UnionTablesQuery(input);
	auto subquery_ref =
	    ParseSubquery(query, context.GetParserOptions(), "Expected a table or a list with tables as input");
	return std::move(subquery_ref);
}